

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classloader.cpp
# Opt level: O0

void __thiscall ClassLoader::setConstantPool(ClassLoader *this,FILE *fp,ClassFile *classFile)

{
  u1 uVar1;
  ushort uVar2;
  CONSTANT_Class_info CVar3;
  CONSTANT_String_info CVar4;
  CONSTANT_Fieldref_info CVar5;
  CONSTANT_Methodref_info CVar6;
  CONSTANT_InterfaceMethodref_info CVar7;
  CONSTANT_Integer_info CVar8;
  CONSTANT_Float_info CVar9;
  CONSTANT_NameAndType_info CVar10;
  cp_info *pcVar11;
  CONSTANT_Long_info CVar12;
  CONSTANT_Double_info CVar13;
  CONSTANT_Utf8_info CVar14;
  undefined6 uStack_6e;
  ushort local_32;
  u1 tag;
  u2 i;
  cp_info *constant_pool;
  u2 poolSize;
  ClassFile *classFile_local;
  FILE *fp_local;
  ClassLoader *this_local;
  
  uVar2 = classFile->constant_pool_count - 1;
  pcVar11 = (cp_info *)malloc((ulong)uVar2 * 0x18);
  classFile->constant_pool = pcVar11;
  pcVar11 = classFile->constant_pool;
  for (local_32 = 0; local_32 < uVar2; local_32 = local_32 + 1) {
    uVar1 = readU1(this,fp);
    pcVar11[local_32].tag = uVar1;
    switch(uVar1) {
    case '\x01':
      CVar14 = getConstantUtf8Info(this,fp);
      CVar12._2_6_ = uStack_6e;
      CVar12.high_bytes._0_2_ = CVar14.length;
      pcVar11[local_32].info.long_info = CVar12;
      pcVar11[local_32].info.utf8_info.bytes = CVar14.bytes;
      break;
    default:
      std::operator<<((ostream *)&std::cerr,
                      "Arquivo .class possui uma tag invalida no pool de constantes");
      exit(5);
    case '\x03':
      CVar8 = getConstantIntegerInfo(this,fp);
      pcVar11[local_32].info.integer_info.bytes = CVar8.bytes;
      break;
    case '\x04':
      CVar9 = getConstantFloatInfo(this,fp);
      pcVar11[local_32].info.float_info.bytes = CVar9.bytes;
      break;
    case '\x05':
      CVar12 = getConstantLongInfo(this,fp);
      pcVar11[local_32].info.long_info = CVar12;
      local_32 = local_32 + 1;
      pcVar11[local_32].tag = '\0';
      break;
    case '\x06':
      CVar13 = getConstantDoubleInfo(this,fp);
      pcVar11[local_32].info.double_info = CVar13;
      local_32 = local_32 + 1;
      pcVar11[local_32].tag = '\0';
      break;
    case '\a':
      CVar3 = getConstantClassInfo(this,fp);
      pcVar11[local_32].info.class_info.name_index = CVar3.name_index;
      break;
    case '\b':
      CVar4 = getConstantStringInfo(this,fp);
      pcVar11[local_32].info.string_info.string_index = CVar4.string_index;
      break;
    case '\t':
      CVar5 = getConstantFieldRefInfo(this,fp);
      pcVar11[local_32].info.fieldref_info = CVar5;
      break;
    case '\n':
      CVar6 = getConstantMethodRefInfo(this,fp);
      pcVar11[local_32].info.methodref_info = CVar6;
      break;
    case '\v':
      CVar7 = getConstantInterfaceMethodRefInfo(this,fp);
      pcVar11[local_32].info.interfaceMethodref_info = CVar7;
      break;
    case '\f':
      CVar10 = getConstantNameAndTypeInfo(this,fp);
      pcVar11[local_32].info.nameAndType_info = CVar10;
    }
  }
  return;
}

Assistant:

void ClassLoader::setConstantPool(FILE *fp, ClassFile *classFile) {
    u2 poolSize = classFile->constant_pool_count - 1;
    classFile->constant_pool = (cp_info*) malloc(sizeof(cp_info) * poolSize);
    
    cp_info *constant_pool = classFile->constant_pool;
    for (u2 i = 0; i < poolSize; i++) {
        u1 tag = readU1(fp);
        constant_pool[i].tag = tag;
        
        switch (tag) {
            case CONSTANT_Class:
                constant_pool[i].info.class_info = getConstantClassInfo(fp);
            break;
            case CONSTANT_Fieldref:
                constant_pool[i].info.fieldref_info = getConstantFieldRefInfo(fp);
            break;
            case CONSTANT_Methodref:
                constant_pool[i].info.methodref_info = getConstantMethodRefInfo(fp);
            break;
            case CONSTANT_InterfaceMethodref:
                constant_pool[i].info.interfaceMethodref_info = getConstantInterfaceMethodRefInfo(fp);
            break;
            case CONSTANT_String:
                constant_pool[i].info.string_info = getConstantStringInfo(fp);
            break;
            case CONSTANT_Integer:
                constant_pool[i].info.integer_info = getConstantIntegerInfo(fp);
            break;
            case CONSTANT_Float:
                constant_pool[i].info.float_info = getConstantFloatInfo(fp);
            break;
            case CONSTANT_Long:
                constant_pool[i].info.long_info = getConstantLongInfo(fp);
                constant_pool[++i].tag = CONSTANT_NULL;
            break;
            case CONSTANT_Double:
                constant_pool[i].info.double_info = getConstantDoubleInfo(fp);
                constant_pool[++i].tag = CONSTANT_NULL;
            break;
            case CONSTANT_NameAndType:
                constant_pool[i].info.nameAndType_info = getConstantNameAndTypeInfo(fp);
            break;
            case CONSTANT_Utf8:
                constant_pool[i].info.utf8_info = getConstantUtf8Info(fp);
            break;
            default:
                cerr << "Arquivo .class possui uma tag invalida no pool de constantes";
                exit(5);
        }
    }
}